

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

uint64_t vfio_map_dma(void *vaddr,uint32_t size)

{
  int iVar1;
  int *piVar2;
  uint in_ESI;
  uint64_t in_RDI;
  char buf [512];
  int err;
  int64_t result;
  int cfd;
  vfio_iommu_type1_dma_map dma_map;
  uint64_t iova;
  ulong local_270;
  undefined1 local_258 [524];
  int local_4c;
  long local_48;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  ulong local_20;
  uint64_t local_18;
  
  local_38 = 0x20;
  local_34 = 3;
  if ((long)(ulong)in_ESI < MIN_DMA_MEMORY) {
    local_270 = MIN_DMA_MEMORY;
  }
  else {
    local_270 = (ulong)in_ESI;
  }
  local_20 = local_270;
  local_18 = in_RDI;
  local_3c = get_vfio_container();
  iVar1 = ioctl(local_3c,0x3b71,&local_38);
  local_48 = (long)iVar1;
  if (local_48 == -1) {
    piVar2 = __errno_location();
    local_4c = *piVar2;
    __xpg_strerror_r(local_4c,local_258,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x134,"vfio_map_dma","IOMMU Map DMA Memory",local_258);
    exit(local_4c);
  }
  return local_18;
}

Assistant:

uint64_t vfio_map_dma(void* vaddr, uint32_t size) {
	uint64_t iova = (uint64_t) vaddr; // map iova to process virtual address
	struct vfio_iommu_type1_dma_map dma_map = {
		.vaddr = (uint64_t) vaddr,
		.iova = iova,
		.size = size < MIN_DMA_MEMORY ? MIN_DMA_MEMORY : size,
		.argsz = sizeof(dma_map),
		.flags = VFIO_DMA_MAP_FLAG_READ | VFIO_DMA_MAP_FLAG_WRITE};
	int cfd = get_vfio_container();
	check_err(ioctl(cfd, VFIO_IOMMU_MAP_DMA, &dma_map), "IOMMU Map DMA Memory");
	return iova;
}